

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

void recall_tree_ns::insert_example_at_node(recall_tree *b,uint32_t cn,example *ec)

{
  node *pnVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  node_pred *pnVar7;
  
  pnVar7 = find_or_create(b,cn,ec);
  dVar2 = updated_entropy(b,cn,ec);
  (b->nodes)._begin[cn].entropy = dVar2;
  pnVar7->label_count = (double)ec->weight + pnVar7->label_count;
  for (; (pnVar1 = (b->nodes)._begin, pnVar7 != pnVar1[cn].preds._begin &&
         (pnVar7[-1].label_count <= pnVar7->label_count &&
          pnVar7->label_count != pnVar7[-1].label_count)); pnVar7 = pnVar7 + -1) {
    uVar5 = pnVar7[-1].label;
    uVar6 = *(undefined4 *)&pnVar7[-1].field_0x4;
    dVar2 = pnVar7[-1].label_count;
    uVar4 = *(undefined4 *)&pnVar7->field_0x4;
    dVar3 = pnVar7->label_count;
    pnVar7[-1].label = pnVar7->label;
    *(undefined4 *)&pnVar7[-1].field_0x4 = uVar4;
    pnVar7[-1].label_count = dVar3;
    pnVar7->label = uVar5;
    *(undefined4 *)&pnVar7->field_0x4 = uVar6;
    pnVar7->label_count = dVar2;
  }
  pnVar1[cn].n = (double)ec->weight + pnVar1[cn].n;
  compute_recall_lbest(b,(b->nodes)._begin + cn);
  return;
}

Assistant:

void insert_example_at_node(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find_or_create(b, cn, ec);

  b.nodes[cn].entropy = updated_entropy(b, cn, ec);

  ls->label_count += ec.weight;

  while (ls != b.nodes[cn].preds.begin() && ls[-1].label_count < ls[0].label_count)
  {
    std::swap(ls[-1], ls[0]);
    --ls;
  }

  b.nodes[cn].n += ec.weight;

  compute_recall_lbest(b, &b.nodes[cn]);
}